

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexCompileTime.h
# Opt level: O0

void __thiscall UnifiedRegex::Node::Node(Node *this,NodeTag tag)

{
  NodeTag tag_local;
  Node *this_local;
  
  this->_vptr_Node = (_func_int **)&PTR___cxa_pure_virtual_01e4fef0;
  this->tag = tag;
  this->features = 0;
  *(uint *)&this->field_0xc = *(uint *)&this->field_0xc & 0xfffffffe;
  *(uint *)&this->field_0xc = *(uint *)&this->field_0xc & 0xfffffffd;
  *(uint *)&this->field_0xc = *(uint *)&this->field_0xc & 0xfffffffb;
  *(uint *)&this->field_0xc = *(uint *)&this->field_0xc & 0xfffffff7;
  *(uint *)&this->field_0xc = *(uint *)&this->field_0xc & 0xffffffef;
  *(uint *)&this->field_0xc = *(uint *)&this->field_0xc & 0xffffffdf;
  *(uint *)&this->field_0xc = *(uint *)&this->field_0xc & 0xffffffbf;
  *(uint *)&this->field_0xc = *(uint *)&this->field_0xc & 0xffffff7f;
  *(uint *)&this->field_0xc = *(uint *)&this->field_0xc & 0xfffffeff;
  *(uint *)&this->field_0xc = *(uint *)&this->field_0xc & 0xfffffdff;
  *(uint *)&this->field_0xc = *(uint *)&this->field_0xc & 0xfffffbff;
  *(uint *)&this->field_0xc = *(uint *)&this->field_0xc & 0xfffff7ff;
  *(uint *)&this->field_0xc = *(uint *)&this->field_0xc & 0xffffefff;
  *(uint *)&this->field_0xc = *(uint *)&this->field_0xc & 0xffffdfff;
  *(uint *)&this->field_0xc = *(uint *)&this->field_0xc & 0xffffbfff;
  this->firstSet = (CharSet<char16_t> *)0x0;
  this->followSet = (CharSet<char16_t> *)0x0;
  CountDomain::CountDomain(&this->prevConsumes);
  CountDomain::CountDomain(&this->thisConsumes);
  CountDomain::CountDomain(&this->followConsumes);
  return;
}

Assistant:

inline Node(NodeTag tag)
            : tag(tag)
            , features(0)
            , firstSet(0)
            , isFirstExact(false)
            , followSet(0)
            , isThisIrrefutable(false)
            , isFollowIrrefutable(false)
            , isWord(false)
            , isThisWillNotProgress(false)
            , isThisWillNotRegress(false)
            , isPrevWillNotProgress(false)
            , isPrevWillNotRegress(false)
            , isFollowEOL(false)
            , isDeterministic(false)
            , isNotInLoop(false)
            , isAtLeastOnce(false)
            , isNotSpeculative(false)
            , isNotNegated(false)
            , hasInitialHardFailBOI(false)
        {
        }